

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O0

void __thiscall avro::DataFileReaderBase::readHeader(DataFileReaderBase *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *peVar2;
  undefined8 uVar3;
  NodePtr *this_00;
  string *msg;
  DataFileReaderBase *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000038;
  const_iterator it;
  Magic m;
  string *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  byte in_stack_fffffffffffffe74;
  byte in_stack_fffffffffffffe75;
  byte bVar4;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  byte bVar5;
  undefined1 uVar6;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb8;
  string local_110 [32];
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_e8;
  byte local_d9;
  string local_d8 [32];
  iterator local_b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a0 [3];
  undefined1 local_82;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_48;
  undefined1 local_3d;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          boost::shared_ptr<avro::Decoder>::operator->(&in_RDI->decoder_);
  peVar2 = std::auto_ptr<avro::InputStream>::operator*(&in_RDI->stream_);
  (*(*(_func_int ***)__lhs)[2])(__lhs,peVar2);
  boost::shared_ptr<avro::Decoder>::operator*(&in_RDI->decoder_);
  decode<boost::array<unsigned_char,4ul>>
            ((Decoder *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,
                                        CONCAT14(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                )))),
             (array<unsigned_char,_4UL> *)in_stack_fffffffffffffe68);
  bVar1 = boost::operator!=((array<unsigned_char,_4UL> *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,
                                              CONCAT15(in_stack_fffffffffffffe75,
                                                       CONCAT14(in_stack_fffffffffffffe74,
                                                                in_stack_fffffffffffffe70)))),
                            (array<unsigned_char,_4UL> *)in_stack_fffffffffffffe68);
  if (bVar1) {
    local_3d = 1;
    uVar3 = __cxa_allocate_exception(0x18);
    std::operator+((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    Exception::Exception
              ((Exception *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT15(in_stack_fffffffffffffe75,
                                          CONCAT14(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70)))),
               in_stack_fffffffffffffe68);
    local_3d = 0;
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  boost::shared_ptr<avro::Decoder>::operator*(&in_RDI->decoder_);
  decode<std::map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ((Decoder *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,
                                        CONCAT14(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                )))),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffe68);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)in_stack_fffffffffffffe68,(key_type *)0x26e5a8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_Rb_tree_const_iterator(&local_48,&local_50);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffe68);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_Rb_tree_const_iterator(&local_58,&local_60);
  bVar1 = std::operator==(&local_48,&local_58);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)0x26e6fa);
    makeSchema(in_stack_00000038);
    ValidSchema::operator=
              ((ValidSchema *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT15(in_stack_fffffffffffffe75,
                                          CONCAT14(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70)))),
               (ValidSchema *)in_stack_fffffffffffffe68);
    ValidSchema::~ValidSchema((ValidSchema *)0x26e731);
    this_00 = ValidSchema::root(&in_RDI->readerSchema_);
    bVar1 = boost::shared_ptr<avro::Node>::operator!(this_00);
    if (bVar1) {
      dataSchema(in_RDI);
      ValidSchema::operator=
                ((ValidSchema *)
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,
                                   CONCAT15(in_stack_fffffffffffffe75,
                                            CONCAT14(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70)))),
                 (ValidSchema *)in_stack_fffffffffffffe68);
    }
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)in_stack_fffffffffffffe68,(key_type *)0x26e780);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_Rb_tree_const_iterator(local_a0,&local_a8);
    local_48._M_node = local_a0[0]._M_node;
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)in_stack_fffffffffffffe68);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_Rb_tree_const_iterator(&local_b0,&local_b8);
    bVar1 = std::operator!=(&local_48,&local_b0);
    local_d9 = 0;
    bVar5 = false;
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)0x26e814);
      toString_abi_cxx11_(in_stack_fffffffffffffeb8);
      local_d9 = 1;
      bVar5 = std::operator==(__lhs,in_stack_fffffffffffffe88);
    }
    uVar6 = bVar5;
    if ((local_d9 & 1) != 0) {
      std::__cxx11::string::~string(local_d8);
    }
    if ((bVar5 & 1) == 0) {
      in_RDI->codec_ = NULL_CODEC;
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffe68);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_Rb_tree_const_iterator(&local_e8,&local_f0);
      bVar1 = std::operator!=(&local_48,&local_e8);
      bVar4 = 0;
      in_stack_fffffffffffffe75 = bVar4;
      if (bVar1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)0x26e8f2);
        toString_abi_cxx11_(in_stack_fffffffffffffeb8);
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(
                                                  in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70)))),
                                in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe75 = bVar4;
        std::__cxx11::string::~string(local_110);
      }
      if ((bVar4 & 1) != 0) {
        msg = (string *)__cxa_allocate_exception(0x18);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)0x26e974);
        toString_abi_cxx11_(in_stack_fffffffffffffeb8);
        std::operator+(in_stack_fffffffffffffe78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar6,CONCAT16(bVar5,CONCAT15(in_stack_fffffffffffffe75,
                                                              CONCAT14(bVar4,
                                                  in_stack_fffffffffffffe70)))));
        Exception::Exception
                  ((Exception *)
                   CONCAT17(uVar6,CONCAT16(bVar5,CONCAT15(in_stack_fffffffffffffe75,
                                                          CONCAT14(bVar4,in_stack_fffffffffffffe70))
                                          )),msg);
        __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      in_RDI->codec_ = DEFLATE_CODEC;
      bVar4 = in_stack_fffffffffffffe74;
    }
    boost::shared_ptr<avro::Decoder>::operator*(&in_RDI->decoder_);
    decode<boost::array<unsigned_char,16ul>>
              ((Decoder *)
               CONCAT17(uVar6,CONCAT16(bVar5,CONCAT15(in_stack_fffffffffffffe75,
                                                      CONCAT14(bVar4,in_stack_fffffffffffffe70)))),
               (array<unsigned_char,_16UL> *)in_stack_fffffffffffffe68);
    return;
  }
  local_82 = 1;
  uVar3 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  Exception::Exception
            ((Exception *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,
                                        CONCAT14(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                )))),in_stack_fffffffffffffe68);
  local_82 = 0;
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void DataFileReaderBase::readHeader()
{
    decoder_->init(*stream_);
    Magic m;
    avro::decode(*decoder_, m);
    if (magic != m) {
        throw Exception("Invalid data file. Magic does not match: "
            + filename_);
    }
    avro::decode(*decoder_, metadata_);
    Metadata::const_iterator it = metadata_.find(AVRO_SCHEMA_KEY);
    if (it == metadata_.end()) {
        throw Exception("No schema in metadata");
    }

    dataSchema_ = makeSchema(it->second);
    if (! readerSchema_.root()) {
        readerSchema_ = dataSchema();
    }

    it = metadata_.find(AVRO_CODEC_KEY);
    if (it != metadata_.end() && toString(it->second) == AVRO_DEFLATE_CODEC) {
        codec_ = DEFLATE_CODEC;
    } else {
        codec_ = NULL_CODEC;
        if (it != metadata_.end() && toString(it->second) != AVRO_NULL_CODEC) {
            throw Exception("Unknown codec in data file: " + toString(it->second));
        }
    }

    avro::decode(*decoder_, sync_);
}